

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O1

LY_ERR lys_compile_when(lysc_ctx *ctx,lysp_when *when_p,uint16_t inherited_flags,lysc_node *parent,
                       lysc_node *ctx_node,lysc_node *node,lysc_when **when_c)

{
  void **ppvVar1;
  ly_ctx *ctx_00;
  lysc_ext_instance *plVar2;
  lysp_ext_instance *plVar3;
  bool bVar4;
  bool bVar5;
  uint16_t parent_flags;
  LY_ERR LVar6;
  LY_ERR LVar7;
  lysc_when ***ppplVar8;
  undefined8 *puVar9;
  lysc_when *plVar10;
  size_t value_len;
  long *plVar11;
  lysp_ext_instance *plVar12;
  lysp_ext_instance *plVar13;
  void *pvVar14;
  long lVar15;
  undefined8 *__ptr;
  char *pcVar16;
  lysc_when **pplVar17;
  LY_ERR LVar18;
  lysc_when *ptr;
  lysc_when *local_40;
  LY_VALUE_FORMAT local_34;
  
  if ((when_p == (lysp_when *)0x0) || (node == (lysc_node *)0x0 && when_c == (lysc_when **)0x0)) {
    __assert_fail("when_p && (node || when_c)",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_node.c"
                  ,0x20a,
                  "LY_ERR lys_compile_when(struct lysc_ctx *, const struct lysp_when *, uint16_t, const struct lysc_node *, const struct lysc_node *, struct lysc_node *, struct lysc_when **)"
                 );
  }
  if (node == (lysc_node *)0x0) {
    local_40 = (lysc_when *)calloc(1,0x38);
    if (local_40 == (lysc_when *)0x0) {
      ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_when");
      return LY_EMEM;
    }
    pplVar17 = &local_40;
    LVar18 = LY_SUCCESS;
  }
  else {
    ppplVar8 = lysc_node_when_p(node);
    pplVar17 = *ppplVar8;
    if (pplVar17 == (lysc_when **)0x0) {
      puVar9 = (undefined8 *)malloc(0x10);
      if (puVar9 == (undefined8 *)0x0) goto LAB_001452c8;
      *puVar9 = 1;
LAB_001452b6:
      *ppplVar8 = (lysc_when **)(puVar9 + 1);
      bVar4 = true;
      LVar18 = LY_SUCCESS;
    }
    else {
      plVar10 = pplVar17[-1];
      pplVar17[-1] = (lysc_when *)((long)&plVar10->cond + 1);
      puVar9 = (undefined8 *)realloc(pplVar17 + -1,(long)plVar10 * 8 + 0x10);
      if (puVar9 != (undefined8 *)0x0) goto LAB_001452b6;
      (*ppplVar8)[-1] = (lysc_when *)&(*ppplVar8)[-1][-1].field_0x37;
LAB_001452c8:
      bVar4 = false;
      LVar18 = LY_EMEM;
      ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_when");
    }
    if (!bVar4) {
      return LVar18;
    }
    pplVar17 = *ppplVar8 + (long)&(*ppplVar8)[-1][-1].field_0x37;
    *pplVar17 = (lysc_when *)0x0;
  }
  if ((when_c == (lysc_when **)0x0) || (plVar10 = *when_c, plVar10 == (lysc_when *)0x0)) {
    plVar10 = (lysc_when *)calloc(1,0x38);
    *pplVar17 = plVar10;
    if (plVar10 == (lysc_when *)0x0) {
      LVar18 = LY_EMEM;
      ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_when_");
    }
    else {
      plVar10->refcount = 1;
      LVar6 = lyxp_expr_parse(ctx->ctx,when_p->cond,0,'\x01',(lyxp_expr **)plVar10);
      LVar18 = LVar6;
      if (LVar6 == LY_SUCCESS) {
        ctx_00 = ctx->ctx;
        pcVar16 = when_p->cond;
        value_len = strlen(pcVar16);
        LVar18 = lyplg_type_prefix_data_new
                           (ctx_00,pcVar16,value_len,LY_VALUE_SCHEMA,ctx->pmod,&local_34,
                            &(*pplVar17)->prefixes);
        if (LVar18 == LY_SUCCESS) {
          (*pplVar17)->context = ctx_node;
          LVar7 = lydict_dup(ctx->ctx,when_p->dsc,&(*pplVar17)->dsc);
          if ((LVar7 == LY_SUCCESS) &&
             (LVar7 = lydict_dup(ctx->ctx,when_p->ref,&(*pplVar17)->ref), LVar7 == LY_SUCCESS)) {
            plVar12 = when_p->exts;
            if (plVar12 == (lysp_ext_instance *)0x0) {
              LVar7 = LY_SUCCESS;
            }
            else {
              plVar2 = (*pplVar17)->exts;
              if (plVar2 == (lysc_ext_instance *)0x0) {
                pvVar14 = (void *)0x0;
                plVar11 = (long *)calloc(1,(long)plVar12[-1].exts * 0x48 + 8);
              }
              else {
                pvVar14 = plVar2[-1].compiled;
                plVar11 = (long *)realloc(&plVar2[-1].compiled,
                                          ((long)&(plVar12[-1].exts)->name +
                                          (long)plVar2[-1].compiled + (long)pvVar14) * 0x48 + 8);
              }
              if (plVar11 == (long *)0x0) {
                LVar7 = LY_EMEM;
                ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).");
                bVar4 = false;
                bVar5 = true;
              }
              else {
                (*pplVar17)->exts = (lysc_ext_instance *)(plVar11 + 1);
                bVar4 = true;
                if ((*pplVar17)->exts == (lysc_ext_instance *)0x0) {
                  bVar5 = false;
                  LVar7 = LY_SUCCESS;
                }
                else {
                  bVar5 = false;
                  if (when_p->exts == (lysp_ext_instance *)0x0) {
                    plVar12 = (lysp_ext_instance *)0x0;
                  }
                  else {
                    plVar12 = when_p->exts[-1].exts;
                  }
                  memset((*pplVar17)->exts + *plVar11,0,
                         ((long)&plVar12->name + (long)pvVar14) * 0x48);
                  LVar7 = LY_SUCCESS;
                  bVar4 = true;
                }
              }
              if (bVar4) {
                lVar15 = 0;
                plVar12 = (lysp_ext_instance *)0x0;
                while( true ) {
                  plVar3 = when_p->exts;
                  if (plVar3 == (lysp_ext_instance *)0x0) {
                    plVar13 = (lysp_ext_instance *)0x0;
                  }
                  else {
                    plVar13 = plVar3[-1].exts;
                  }
                  if (plVar13 <= plVar12) break;
                  plVar10 = *pplVar17;
                  plVar2 = plVar10->exts;
                  pvVar14 = plVar2[-1].compiled;
                  plVar2[-1].compiled = (void *)((long)pvVar14 + 1);
                  LVar7 = lys_compile_ext(ctx,(lysp_ext_instance *)((long)&plVar3->name + lVar15),
                                          plVar2 + (-(ulong)(plVar2 == (lysc_ext_instance *)0x0) |
                                                   (ulong)pvVar14),plVar10);
                  if (LVar7 != LY_SUCCESS) {
                    if (LVar7 != LY_ENOT) {
                      bVar5 = true;
                      goto LAB_00145712;
                    }
                    ppvVar1 = &(*pplVar17)->exts[-1].compiled;
                    *ppvVar1 = (void *)((long)*ppvVar1 + -1);
                  }
                  plVar12 = (lysp_ext_instance *)((long)&plVar12->name + 1);
                  lVar15 = lVar15 + 0x70;
                  LVar7 = LY_SUCCESS;
                }
                bVar5 = false;
              }
LAB_00145712:
              if (bVar5) goto LAB_00145559;
              LVar18 = LVar6;
              if (bVar5) goto LAB_0014542d;
            }
            if (parent == (lysc_node *)0x0) {
              parent_flags = 0;
              pcVar16 = (char *)0x0;
            }
            else {
              parent_flags = parent->flags;
              pcVar16 = parent->name;
            }
            LVar18 = lys_compile_status(ctx,0,inherited_flags,parent_flags,pcVar16,"when",
                                        &(*pplVar17)->flags);
            if (LVar18 != LY_SUCCESS) goto LAB_0014542d;
          }
LAB_00145559:
          LVar18 = LVar7;
        }
      }
    }
LAB_0014542d:
    if (LVar18 != LY_SUCCESS) {
      return LVar18;
    }
    LVar18 = LY_SUCCESS;
    if (when_c != (lysc_when **)0x0) {
      *when_c = *pplVar17;
    }
  }
  else {
    plVar10->refcount = plVar10->refcount + 1;
    *pplVar17 = plVar10;
  }
  if (node == (lysc_node *)0x0) {
    return LVar18;
  }
  if ((ctx->compile_opts & 3) == 0) {
    plVar10 = *pplVar17;
    puVar9 = (undefined8 *)calloc(1,0x10);
    LVar18 = LY_SUCCESS;
    if (puVar9 == (undefined8 *)0x0) {
      puVar9 = (undefined8 *)0x0;
    }
    else {
      *puVar9 = node;
      puVar9[1] = plVar10;
      LVar6 = ly_set_add(&ctx->unres->whens,puVar9,'\x01',(uint32_t *)0x0);
      __ptr = (undefined8 *)0x0;
      if (LVar6 == LY_SUCCESS) goto LAB_001454de;
    }
    __ptr = puVar9;
    LVar18 = LY_EMEM;
    ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysc_unres_when_add");
  }
  else {
    LVar18 = LY_SUCCESS;
    __ptr = (undefined8 *)0x0;
  }
LAB_001454de:
  free(__ptr);
  return LVar18;
}

Assistant:

LY_ERR
lys_compile_when(struct lysc_ctx *ctx, const struct lysp_when *when_p, uint16_t inherited_flags, const struct lysc_node *parent,
        const struct lysc_node *ctx_node, struct lysc_node *node, struct lysc_when **when_c)
{
    LY_ERR rc = LY_SUCCESS;
    struct lysc_when **new_when, ***node_when, *ptr;

    assert(when_p && (node || when_c));

    if (node) {
        /* get the when array */
        node_when = lysc_node_when_p(node);

        /* create new when pointer */
        LY_ARRAY_NEW_GOTO(ctx->ctx, *node_when, new_when, rc, cleanup);
    } else {
        /* individual when */
        new_when = &ptr;
        *new_when = calloc(1, sizeof **new_when);
        LY_CHECK_ERR_GOTO(!*new_when, LOGMEM(ctx->ctx); rc = LY_EMEM, cleanup);
    }

    if (!when_c || !(*when_c)) {
        /* compile when */
        LY_CHECK_GOTO(rc = lys_compile_when_(ctx, when_p, inherited_flags, parent, ctx_node, new_when), cleanup);

        /* remember the compiled when for sharing */
        if (when_c) {
            *when_c = *new_when;
        }
    } else {
        /* use the previously compiled when */
        ++(*when_c)->refcount;
        *new_when = *when_c;
    }

    if (node) {
        /* add when to unres if there is a node for evaluation (not for extension instances) */
        LY_CHECK_GOTO(rc = lysc_unres_when_add(ctx, *new_when, node), cleanup);
    }

cleanup:
    return rc;
}